

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

bool __thiscall
Wasm::PolymorphicEmitInfo::IsEquivalent(PolymorphicEmitInfo *this,PolymorphicEmitInfo other)

{
  bool bVar1;
  EmitInfo EVar2;
  EmitInfo EVar3;
  uint32 index;
  undefined1 local_38 [8];
  PolymorphicEmitInfo other_local;
  
  other_local._0_8_ = other.field_1;
  local_38._0_4_ = other.count;
  if (this->count == local_38._0_4_) {
    if (local_38._0_4_ == 0) {
      bVar1 = true;
    }
    else {
      index = 0;
      do {
        EVar2 = GetInfo(this,index);
        EVar3 = GetInfo((PolymorphicEmitInfo *)local_38,index);
        bVar1 = ((ulong)EVar3 ^ (ulong)EVar2) >> 0x20 == 0;
        if (!bVar1) {
          return bVar1;
        }
        index = index + 1;
      } while (index < this->count);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool PolymorphicEmitInfo::IsEquivalent(PolymorphicEmitInfo other) const
{
    if (Count() != other.Count())
    {
        return false;
    }
    for (uint32 i = 0; i < Count(); ++i)
    {
        if (GetInfo(i).type != other.GetInfo(i).type)
        {
            return false;
        }
    }
    return true;
}